

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_log_register_callback(ma_log *pLog,ma_log_callback callback)

{
  uint uVar1;
  ma_result mVar2;
  ulong uVar3;
  
  if (callback.onLog == (ma_log_callback_proc)0x0 || pLog == (ma_log *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    uVar1 = pLog->callbackCount;
    uVar3 = (ulong)uVar1;
    if (uVar3 != 4) {
      pLog->callbacks[uVar3].onLog = callback.onLog;
      pLog->callbacks[uVar3].pUserData = callback.pUserData;
      pLog->callbackCount = uVar1 + 1;
      return MA_SUCCESS;
    }
    mVar2 = MA_OUT_OF_MEMORY;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_log_register_callback(ma_log* pLog, ma_log_callback callback)
{
    ma_result result = MA_SUCCESS;

    if (pLog == NULL || callback.onLog == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        if (pLog->callbackCount == ma_countof(pLog->callbacks)) {
            result = MA_OUT_OF_MEMORY;  /* Reached the maximum allowed log callbacks. */
        } else {
            pLog->callbacks[pLog->callbackCount] = callback;
            pLog->callbackCount += 1;
        }
    }
    ma_log_unlock(pLog);

    return result;
}